

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

double duckdb::NoInfiniteDoubleWrapper<duckdb::SinOperator>::Operation<double,double>(double input)

{
  OutOfRangeException *this;
  bool bVar1;
  double dVar2;
  string local_40;
  
  bVar1 = Value::IsFinite<double>(input);
  if (bVar1) {
    dVar2 = sin(input);
    return dVar2;
  }
  bVar1 = Value::IsNan<double>(input);
  if (bVar1) {
    return input;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"input value %lf is out of range for numeric function","");
  OutOfRangeException::OutOfRangeException<double>(this,&local_40,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}